

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

TrackAllocData *
Memory::TrackAllocData::CreateTrackAllocData
          (TrackAllocData *__return_storage_ptr__,type_info *typeinfo,size_t size,size_t count,
          char *filename,DWORD line)

{
  DWORD line_local;
  char *filename_local;
  size_t count_local;
  size_t size_local;
  type_info *typeinfo_local;
  
  __return_storage_ptr__->typeinfo = typeinfo;
  __return_storage_ptr__->plusSize = size;
  __return_storage_ptr__->count = count;
  __return_storage_ptr__->filename = filename;
  __return_storage_ptr__->line = line;
  return __return_storage_ptr__;
}

Assistant:

static TrackAllocData CreateTrackAllocData(type_info const& typeinfo, size_t size, size_t count, char const * const filename, DWORD line)
    {
        TrackAllocData data;
        data.typeinfo = &typeinfo;
        data.plusSize = size;
        data.count = count;
        data.filename = filename;
        data.line = line;

        return data;
    }